

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

void __thiscall ncnn::Input::Input(Input *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Layer_00603670;
  (this->super_Layer).support_image_storage = true;
  (this->super_Layer).support_bf16_storage = true;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = true;
  (this->super_Layer).support_vulkan = true;
  (this->super_Layer).support_packing = true;
  return;
}

Assistant:

Input::Input()
{
    one_blob_only = true;
    support_inplace = true;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
    support_image_storage = true;
}